

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SafeInt.hpp
# Opt level: O2

SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>
operator/(short lhs,SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> rhs)

{
  bool bVar1;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> *result_00;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> result;
  short ret;
  short local_20;
  char local_1d;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1c;
  SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter> local_1b;
  short local_1a;
  
  result_00 = &local_1c;
  local_1c.m_int = '\0';
  local_20 = lhs;
  bVar1 = DivisionCornerCaseHelper2<char,_short,_safeint_exception_handlers::SafeInt_InvalidParameter,_1>
          ::DivisionCornerCase2(lhs,rhs,result_00);
  if (!bVar1) {
    local_1a = 0;
    local_1d = rhs.m_int;
    DivisionHelper<short,_char,_5>::
    DivideThrow<safeint_exception_handlers::SafeInt_InvalidParameter>(&local_20,&local_1d,&local_1a)
    ;
    result_00 = &local_1b;
    SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>::SafeInt<short>
              (result_00,&local_1a);
  }
  return (SafeInt<char,_safeint_exception_handlers::SafeInt_InvalidParameter>)result_00->m_int;
}

Assistant:

SAFEINT_CONSTEXPR14 SafeInt< T, E > operator /( U lhs, SafeInt< T, E > rhs ) SAFEINT_CPP_THROW
{
    // Corner case - has to be handled seperately
    SafeInt< T, E > result;
    if( DivisionCornerCaseHelper< T, U, E, (int)DivisionMethod< U, T >::method == (int)DivisionState_UnsignedSigned >::DivisionCornerCase1( lhs, rhs, result ) )
        return result;

    if( DivisionCornerCaseHelper2< T, U, E, safeint_internal::type_compare< T, U >::isBothSigned >::DivisionCornerCase2( lhs, rhs, result ) )
        return result;

    // Otherwise normal logic works with addition of bounds check when casting from U->T
    U ret = 0;
    DivisionHelper< U, T, DivisionMethod< U, T >::method >::template DivideThrow< E >( lhs, (T)rhs, ret );
    return SafeInt< T, E >( ret );
}